

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack20_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *in;
  *out = uVar1 & 0xfffff;
  out[1] = uVar1 >> 0x14;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x14 | (uVar2 & 0xff) << 0xc;
  out[2] = uVar2 >> 8 & 0xfffff;
  out[3] = uVar2 >> 0x1c;
  uVar1 = in[2];
  uVar3 = in[3];
  out[3] = uVar2 >> 0x1c | (uVar1 & 0xffff) << 4;
  out[4] = uVar1 >> 0x10;
  out[4] = uVar1 >> 0x10 | (uVar3 & 0xf) << 0x10;
  out[5] = uVar3 >> 4 & 0xfffff;
  out[6] = uVar3 >> 0x18;
  uVar1 = in[4];
  out[6] = uVar3 >> 0x18 | (uVar1 & 0xfff) << 8;
  out[7] = uVar1 >> 0xc;
  uVar1 = in[5];
  out[8] = uVar1 & 0xfffff;
  uVar2 = in[6];
  out[9] = uVar1 >> 0x14;
  out[9] = uVar1 >> 0x14 | (uVar2 & 0xff) << 0xc;
  out[10] = uVar2 >> 8 & 0xfffff;
  uVar1 = in[7];
  out[0xb] = uVar2 >> 0x1c;
  out[0xb] = uVar2 >> 0x1c | (uVar1 & 0xffff) << 4;
  out[0xc] = uVar1 >> 0x10;
  uVar2 = in[8];
  out[0xc] = uVar1 >> 0x10 | (uVar2 & 0xf) << 0x10;
  out[0xd] = uVar2 >> 4 & 0xfffff;
  out[0xe] = uVar2 >> 0x18;
  uVar1 = in[9];
  out[0xe] = uVar2 >> 0x18 | (uVar1 & 0xfff) << 8;
  out[0xf] = uVar1 >> 0xc;
  return in + 10;
}

Assistant:

const uint32_t *__fastunpack20_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 8)) << (20 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 20);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 16)) << (20 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 4)) << (20 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 20);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 12)) << (20 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 8)) << (20 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 20);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 16)) << (20 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 4)) << (20 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 20);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 12)) << (20 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  out++;

  return in;
}